

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O1

void __thiscall
mocker::nasm::Section::
emplaceLine<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>>
          (Section *this,string *label,shared_ptr<mocker::nasm::MemoryAddr> *args,
          shared_ptr<mocker::nasm::Addr> *args_1)

{
  size_t *psVar1;
  _Node *p_Var2;
  undefined1 local_31;
  shared_ptr<mocker::nasm::Mov> local_30;
  
  local_30.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::nasm::Mov,std::allocator<mocker::nasm::Mov>,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>>
            (&local_30.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(Mov **)&local_30,(allocator<mocker::nasm::Mov> *)&local_31,args,args_1);
  p_Var2 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
           _M_create_node<std::__cxx11::string,std::shared_ptr<mocker::nasm::Mov>>
                     ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&this->lines,
                      label,&local_30);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->lines).super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_30.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void emplaceLine(std::string label, Args &&... args) {
    lines.emplace_back(std::move(label),
                       std::make_shared<Type>(std::forward<Args>(args)...));
  }